

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

iterator __thiscall
slang::SmallVectorBase<(anonymous_namespace)::Constructable>::insert
          (SmallVectorBase<(anonymous_namespace)::Constructable> *this,const_iterator pos,
          Constructable *val)

{
  size_type sVar1;
  pointer pCVar2;
  undefined8 in_RAX;
  pointer pCVar3;
  long lVar4;
  Constructable *src;
  Constructable temp;
  Constructable local_28;
  
  sVar1 = this->len;
  if (sVar1 == this->cap) {
    pCVar3 = emplaceRealloc<(anonymous_namespace)::Constructable_const&>(this,pos,val);
    return pCVar3;
  }
  pCVar2 = this->data_;
  pCVar3 = pCVar2 + sVar1;
  if ((long)pCVar3 - (long)pos == 0) {
    pCVar3->constructed = true;
    pCVar3->value = val->value;
    (anonymous_namespace)::Constructable::numConstructorCalls =
         (anonymous_namespace)::Constructable::numConstructorCalls + 1;
    (anonymous_namespace)::Constructable::numCopyConstructorCalls =
         (anonymous_namespace)::Constructable::numCopyConstructorCalls + 1;
    this->len = sVar1 + 1;
  }
  else {
    local_28._1_7_ = SUB87((ulong)in_RAX >> 8,0);
    local_28.constructed = true;
    local_28.value = val->value;
    (anonymous_namespace)::Constructable::numCopyConstructorCalls =
         (anonymous_namespace)::Constructable::numCopyConstructorCalls + 1;
    pCVar3->constructed = true;
    pCVar3->value = pCVar3[-1].value;
    pCVar3[-1].value = 0;
    (anonymous_namespace)::Constructable::numConstructorCalls =
         (anonymous_namespace)::Constructable::numConstructorCalls + 2;
    (anonymous_namespace)::Constructable::numMoveConstructorCalls =
         (anonymous_namespace)::Constructable::numMoveConstructorCalls + 1;
    lVar4 = ((long)pCVar3 - (long)pos) + -8 >> 3;
    if (0 < lVar4) {
      lVar4 = lVar4 + 1;
      src = pCVar2 + (sVar1 - 2);
      do {
        anon_unknown.dwarf_d92100::Constructable::operator=(src + 1,src);
        lVar4 = lVar4 + -1;
        src = src + -1;
      } while (1 < lVar4);
    }
    anon_unknown.dwarf_d92100::Constructable::operator=(pos,&local_28);
    this->len = this->len + 1;
    anon_unknown.dwarf_d92100::Constructable::~Constructable(&local_28);
  }
  return pos;
}

Assistant:

iterator insert(const_iterator pos, const T& val) { return emplace(pos, val); }